

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
::raw_hash_set(raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
               *this,raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                     *that,allocator_type *a)

{
  char cVar1;
  slot_type *psVar2;
  size_t sVar3;
  unsigned_long uVar4;
  ctrl_t *pcVar5;
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  undefined1 auVar14 [11];
  undefined1 auVar15 [12];
  undefined1 auVar16 [13];
  undefined1 auVar17 [14];
  uint uVar19;
  EnumClass *elem;
  anon_union_8_1_a8a14541_for_iterator_1 aVar20;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar21;
  pair<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>::iterator,_bool>
  pStack_48;
  char *pcVar18;
  
  this->size_ = 0;
  this->capacity_ = 0;
  this->ctrl_ = (ctrl_t *)0x0;
  this->slots_ = (slot_type *)0x0;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Tuple_impl<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>.
  super__Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_false>.
  _M_head_impl.id_ = a->id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingEqual>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
       .
       super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
       .super__Head_base<2UL,_phmap::priv::StatefulTestingEqual,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingEqual>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .
  super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
  super_WithId<phmap::priv::StatefulTestingHash>.id_ =
       (that->settings_).
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
       .super__Head_base<1UL,_phmap::priv::StatefulTestingHash,_false>._M_head_impl.
       super_WithId<phmap::priv::StatefulTestingHash>.id_;
  (this->settings_).
  super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
  .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
  if (a->id_ == (that->settings_).
                super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                .
                super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                .
                super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
                .super__Tuple_impl<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>.
                super__Head_base<3UL,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>,_false>
                ._M_head_impl.id_) {
    this->ctrl_ = that->ctrl_;
    that->ctrl_ = (ctrl_t *)0x0;
    psVar2 = this->slots_;
    this->slots_ = that->slots_;
    that->slots_ = psVar2;
    this->size_ = that->size_;
    that->size_ = 0;
    sVar3 = this->capacity_;
    this->capacity_ = that->capacity_;
    that->capacity_ = sVar3;
    uVar4 = (this->settings_).
            super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
            .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    (this->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
         (that->settings_).
         super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
         .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
    (that->settings_).
    super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>_>
    .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar4;
  }
  else {
    rehash(this,(long)(that->size_ - 1) / 7 + that->size_);
    iVar21 = begin(that);
    pcVar18 = iVar21.ctrl_;
    pcVar5 = that->ctrl_;
    sVar3 = that->capacity_;
    while (pcVar18 != pcVar5 + sVar3) {
      aVar20 = iVar21.field_1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = *aVar20.slot_;
      raw_hash_set<phmap::priv::FlatHashSetPolicy<phmap::priv::hash_internal::EnumClass>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<phmap::priv::hash_internal::EnumClass>>
      ::
      emplace_decomposable<phmap::priv::hash_internal::EnumClass,phmap::priv::hash_internal::EnumClass_const>
                (&pStack_48,this,aVar20.slot_,
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar7,0),aVar20.slot_);
      aVar20.slot_ = aVar20.slot_ + 1;
      cVar1 = iVar21.ctrl_[1];
      pcVar18 = iVar21.ctrl_ + 1;
      while (cVar1 < -1) {
        iVar10 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                        );
        iVar11 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                        );
        iVar12 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                        );
        iVar13 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        == CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                        );
        in_XMM1_Ba = -(*pcVar18 < (char)iVar10);
        in_XMM1_Bb = -(pcVar18[1] < (char)((uint)iVar10 >> 8));
        in_XMM1_Bc = -(pcVar18[2] < (char)((uint)iVar10 >> 0x10));
        in_XMM1_Bd = -(pcVar18[3] < (char)((uint)iVar10 >> 0x18));
        in_XMM1_Be = -(pcVar18[4] < (char)iVar11);
        in_XMM1_Bf = -(pcVar18[5] < (char)((uint)iVar11 >> 8));
        in_XMM1_Bg = -(pcVar18[6] < (char)((uint)iVar11 >> 0x10));
        in_XMM1_Bh = -(pcVar18[7] < (char)((uint)iVar11 >> 0x18));
        in_XMM1_Bi = -(pcVar18[8] < (char)iVar12);
        in_XMM1_Bj = -(pcVar18[9] < (char)((uint)iVar12 >> 8));
        in_XMM1_Bk = -(pcVar18[10] < (char)((uint)iVar12 >> 0x10));
        in_XMM1_Bl = -(pcVar18[0xb] < (char)((uint)iVar12 >> 0x18));
        in_XMM1_Bm = -(pcVar18[0xc] < (char)iVar13);
        in_XMM1_Bn = -(pcVar18[0xd] < (char)((uint)iVar13 >> 8));
        in_XMM1_Bo = -(pcVar18[0xe] < (char)((uint)iVar13 >> 0x10));
        in_XMM1_Bp = -(pcVar18[0xf] < (char)((uint)iVar13 >> 0x18));
        auVar8[1] = in_XMM1_Bb;
        auVar8[0] = in_XMM1_Ba;
        auVar8[2] = in_XMM1_Bc;
        auVar8[3] = in_XMM1_Bd;
        auVar8[4] = in_XMM1_Be;
        auVar8[5] = in_XMM1_Bf;
        auVar8[6] = in_XMM1_Bg;
        auVar8[7] = in_XMM1_Bh;
        auVar8[8] = in_XMM1_Bi;
        auVar8[9] = in_XMM1_Bj;
        auVar8[10] = in_XMM1_Bk;
        auVar8[0xb] = in_XMM1_Bl;
        auVar8[0xc] = in_XMM1_Bm;
        auVar8[0xd] = in_XMM1_Bn;
        auVar8[0xe] = in_XMM1_Bo;
        auVar8[0xf] = in_XMM1_Bp;
        auVar9[1] = in_XMM1_Bb;
        auVar9[0] = in_XMM1_Ba;
        auVar9[2] = in_XMM1_Bc;
        auVar9[3] = in_XMM1_Bd;
        auVar9[4] = in_XMM1_Be;
        auVar9[5] = in_XMM1_Bf;
        auVar9[6] = in_XMM1_Bg;
        auVar9[7] = in_XMM1_Bh;
        auVar9[8] = in_XMM1_Bi;
        auVar9[9] = in_XMM1_Bj;
        auVar9[10] = in_XMM1_Bk;
        auVar9[0xb] = in_XMM1_Bl;
        auVar9[0xc] = in_XMM1_Bm;
        auVar9[0xd] = in_XMM1_Bn;
        auVar9[0xe] = in_XMM1_Bo;
        auVar9[0xf] = in_XMM1_Bp;
        auVar17[1] = in_XMM1_Bd;
        auVar17[0] = in_XMM1_Bc;
        auVar17[2] = in_XMM1_Be;
        auVar17[3] = in_XMM1_Bf;
        auVar17[4] = in_XMM1_Bg;
        auVar17[5] = in_XMM1_Bh;
        auVar17[6] = in_XMM1_Bi;
        auVar17[7] = in_XMM1_Bj;
        auVar17[8] = in_XMM1_Bk;
        auVar17[9] = in_XMM1_Bl;
        auVar17[10] = in_XMM1_Bm;
        auVar17[0xb] = in_XMM1_Bn;
        auVar17[0xc] = in_XMM1_Bo;
        auVar17[0xd] = in_XMM1_Bp;
        auVar16[1] = in_XMM1_Be;
        auVar16[0] = in_XMM1_Bd;
        auVar16[2] = in_XMM1_Bf;
        auVar16[3] = in_XMM1_Bg;
        auVar16[4] = in_XMM1_Bh;
        auVar16[5] = in_XMM1_Bi;
        auVar16[6] = in_XMM1_Bj;
        auVar16[7] = in_XMM1_Bk;
        auVar16[8] = in_XMM1_Bl;
        auVar16[9] = in_XMM1_Bm;
        auVar16[10] = in_XMM1_Bn;
        auVar16[0xb] = in_XMM1_Bo;
        auVar16[0xc] = in_XMM1_Bp;
        auVar15[1] = in_XMM1_Bf;
        auVar15[0] = in_XMM1_Be;
        auVar15[2] = in_XMM1_Bg;
        auVar15[3] = in_XMM1_Bh;
        auVar15[4] = in_XMM1_Bi;
        auVar15[5] = in_XMM1_Bj;
        auVar15[6] = in_XMM1_Bk;
        auVar15[7] = in_XMM1_Bl;
        auVar15[8] = in_XMM1_Bm;
        auVar15[9] = in_XMM1_Bn;
        auVar15[10] = in_XMM1_Bo;
        auVar15[0xb] = in_XMM1_Bp;
        auVar14[1] = in_XMM1_Bg;
        auVar14[0] = in_XMM1_Bf;
        auVar14[2] = in_XMM1_Bh;
        auVar14[3] = in_XMM1_Bi;
        auVar14[4] = in_XMM1_Bj;
        auVar14[5] = in_XMM1_Bk;
        auVar14[6] = in_XMM1_Bl;
        auVar14[7] = in_XMM1_Bm;
        auVar14[8] = in_XMM1_Bn;
        auVar14[9] = in_XMM1_Bo;
        auVar14[10] = in_XMM1_Bp;
        uVar19 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar17 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar16 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar15 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar14 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar6 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
          }
        }
        aVar20.slot_ = aVar20.slot_ + uVar6;
        cVar1 = pcVar18[uVar6];
        pcVar18 = pcVar18 + uVar6;
      }
      iVar21.field_1.slot_ = aVar20.slot_;
      iVar21.ctrl_ = pcVar18;
    }
  }
  return;
}

Assistant:

raw_hash_set(raw_hash_set&& that, const allocator_type& a)
        : ctrl_(EmptyGroup<std_alloc_t>()),
          slots_(nullptr),
          size_(0),
          capacity_(0),
          settings_(0, that.hash_ref(), that.eq_ref(), a) {
        if (a == that.alloc_ref()) {
            std::swap(ctrl_, that.ctrl_);
            std::swap(slots_, that.slots_);
            std::swap(size_, that.size_);
            std::swap(capacity_, that.capacity_);
            std::swap(growth_left(), that.growth_left());
            std::swap(infoz_, that.infoz_);
        } else {
            reserve(that.size());
            // Note: this will copy elements of dense_set and unordered_set instead of
            // moving them. This can be fixed if it ever becomes an issue.
            for (auto& elem : that) insert(std::move(elem));
        }
    }